

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O1

Vec_Ptr_t * Aig_ManSupportsInverse(Aig_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *__ptr;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  undefined8 *puVar6;
  void *pvVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  
  __ptr = Aig_ManSupports(p);
  iVar2 = p->nObjs[2];
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  iVar8 = 8;
  if (6 < iVar2 - 1U) {
    iVar8 = iVar2;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar8;
  if (iVar8 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((long)iVar8 << 3);
  }
  pVVar4->pArray = ppvVar5;
  if (0 < p->nObjs[2]) {
    uVar10 = pVVar4->nCap;
    iVar2 = pVVar4->nSize;
    ppvVar5 = pVVar4->pArray;
    lVar9 = 0;
    do {
      puVar6 = (undefined8 *)malloc(0x10);
      *puVar6 = 0x10;
      pvVar7 = malloc(0x40);
      puVar6[1] = pvVar7;
      if (iVar2 + (int)lVar9 == uVar10) {
        if ((int)uVar10 < 0x10) {
          if (ppvVar5 == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(ppvVar5,0x80);
          }
          uVar10 = 0x10;
        }
        else {
          uVar1 = uVar10 * 2;
          if (SBORROW4(uVar10,uVar1) != 0 < (int)uVar10) {
            uVar10 = uVar1;
            if (ppvVar5 == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar1 << 3);
            }
            else {
              ppvVar5 = (void **)realloc(ppvVar5,(ulong)uVar1 << 3);
            }
          }
        }
      }
      ppvVar5[iVar2 + lVar9] = puVar6;
      lVar9 = lVar9 + 1;
    } while ((int)lVar9 < p->nObjs[2]);
    pVVar4->nSize = iVar2 + (int)lVar9;
    pVVar4->nCap = uVar10;
    pVVar4->pArray = ppvVar5;
  }
  iVar2 = __ptr->nSize;
  lVar9 = (long)iVar2;
  if (0 < lVar9) {
    ppvVar5 = __ptr->pArray;
    lVar11 = 0;
    do {
      pvVar7 = ppvVar5[lVar11];
      iVar8 = *(int *)((long)pvVar7 + 4);
      if (iVar8 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
      }
      *(uint *)((long)pvVar7 + 4) = iVar8 - 1U;
      if (iVar8 != 1) {
        iVar8 = *(int *)(*(long *)((long)pvVar7 + 8) + (ulong)(iVar8 - 1U) * 4);
        lVar12 = 0;
        do {
          iVar3 = *(int *)(*(long *)((long)pvVar7 + 8) + lVar12 * 4);
          if (((long)iVar3 < 0) || (pVVar4->nSize <= iVar3)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          Vec_IntPush((Vec_Int_t *)pVVar4->pArray[iVar3],iVar8);
          lVar12 = lVar12 + 1;
        } while (lVar12 < *(int *)((long)pvVar7 + 4));
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != lVar9);
  }
  if (0 < iVar2) {
    ppvVar5 = __ptr->pArray;
    lVar11 = 0;
    do {
      pvVar7 = ppvVar5[lVar11];
      if (pvVar7 != (void *)0x0) {
        if (*(void **)((long)pvVar7 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar7 + 8));
          *(undefined8 *)((long)pvVar7 + 8) = 0;
        }
        free(pvVar7);
      }
      lVar11 = lVar11 + 1;
    } while (lVar9 != lVar11);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Ptr_t *)0x0) {
    free(__ptr);
  }
  return pVVar4;
}

Assistant:

Vec_Ptr_t * Aig_ManSupportsInverse( Aig_Man_t * p )
{
    Vec_Ptr_t * vSupps, * vSuppsInv;
    Vec_Int_t * vSupp;
    int i, k, iIn, iOut;
    // get structural supports for each output
    vSupps = Aig_ManSupports( p );
    // start the inverse supports
    vSuppsInv = Vec_PtrAlloc( Aig_ManCiNum(p) );
    for ( i = 0; i < Aig_ManCiNum(p); i++ )
        Vec_PtrPush( vSuppsInv, Vec_IntAlloc(8) );
    // transforms the supports into the inverse supports
    Vec_PtrForEachEntry( Vec_Int_t *, vSupps, vSupp, i )
    {
        iOut = Vec_IntPop( vSupp );
        Vec_IntForEachEntry( vSupp, iIn, k )
            Vec_IntPush( (Vec_Int_t *)Vec_PtrEntry(vSuppsInv, iIn), iOut );
    }
    Vec_VecFree( (Vec_Vec_t *)vSupps );
    return vSuppsInv;
}